

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

UBool enumToU(UConverterMBCSTable *mbcsTable,int8_t *stateProps,int32_t state,uint32_t offset,
             uint32_t value,UConverterEnumToUCallback *callback,void *context,UErrorCode *pErrorCode
             )

{
  byte bVar1;
  uint uVar2;
  int32_t (*paiVar3) [256];
  uint16_t *puVar4;
  UBool UVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  UChar32 codePoints [32];
  void *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  uint uVar11;
  uint local_b8 [34];
  
  bVar1 = stateProps[state];
  uVar9 = (uint)bVar1 * 4 & 0xe0;
  if ((uVar9 == 0) && (uVar9 = 0, '?' < (char)bVar1)) {
    local_b8[0] = 0xffffffff;
    uVar9 = 1;
  }
  paiVar3 = mbcsTable->stateTable;
  puVar4 = mbcsTable->unicodeCodeUnits;
  uVar11 = value << 8;
  uVar8 = 0xffffffff;
  do {
    if ((int)((bVar1 & 7) * 0x20 + 0x20) <= (int)uVar9) {
      return '\x01';
    }
    uVar2 = paiVar3[state][(int)uVar9];
    if ((int)uVar2 < 0) {
      uVar6 = 0xffffffff;
      switch(uVar2 >> 0x14 & 0xf) {
      case 0:
        uVar6 = uVar2 & 0xffff;
        break;
      case 1:
        uVar6 = (uVar2 & 0xfffff) + 0x10000;
        break;
      case 4:
        uVar6 = (uint)puVar4[(int)((uVar2 & 0xffff) + offset)];
        if (0xfffd < uVar6) {
          uVar6 = 0xffffffff;
        }
        break;
      case 5:
        uVar6 = (uint)puVar4[(int)((uVar2 & 0xffff) + offset)];
        if (0xd7ff < uVar6) {
          iVar7 = (uVar2 & 0xffff) + offset + 1;
          if (uVar6 < 0xdc00) {
            uVar6 = (uint)puVar4[iVar7] + (uVar6 & 0x3ff) * 0x400 + 0x2400;
          }
          else {
            bVar10 = uVar6 == 0xe000;
            uVar6 = 0xffffffff;
            if (bVar10) {
              uVar6 = (uint)puVar4[iVar7];
            }
          }
        }
      }
      local_b8[uVar9 & 0x1f] = uVar6;
      uVar8 = uVar8 & uVar6;
LAB_002c3df3:
      uVar2 = uVar9 + 1;
      bVar10 = true;
      if (((uVar2 & 0x1f) == 0) && (-1 < (int)uVar8)) {
        UVar5 = writeStage3Roundtrip(callback,uVar9 - 0x1f | uVar11,(UChar32 *)local_b8);
        bVar10 = UVar5 != '\0';
        uVar8 = uVar8 | -(uint)(UVar5 != '\0');
      }
    }
    else {
      if ((stateProps[uVar2 >> 0x18] < '\0') ||
         (UVar5 = enumToU(mbcsTable,stateProps,uVar2 >> 0x18,(uVar2 & 0xffffff) + offset,
                          uVar9 | uVar11,callback,in_stack_ffffffffffffff18,
                          (UErrorCode *)CONCAT44(uVar11,in_stack_ffffffffffffff20)), UVar5 != '\0'))
      {
        local_b8[uVar9 & 0x1f] = 0xffffffff;
        goto LAB_002c3df3;
      }
      bVar10 = false;
      uVar2 = uVar9;
    }
    uVar9 = uVar2;
    if (!bVar10) {
      return '\0';
    }
  } while( true );
}

Assistant:

static UBool
enumToU(UConverterMBCSTable *mbcsTable, int8_t stateProps[],
        int32_t state, uint32_t offset,
        uint32_t value,
        UConverterEnumToUCallback *callback, const void *context,
        UErrorCode *pErrorCode) {
    UChar32 codePoints[32];
    const int32_t *row;
    const uint16_t *unicodeCodeUnits;
    UChar32 anyCodePoints;
    int32_t b, limit;

    row=mbcsTable->stateTable[state];
    unicodeCodeUnits=mbcsTable->unicodeCodeUnits;

    value<<=8;
    anyCodePoints=-1;  /* becomes non-negative if there is a mapping */

    b=(stateProps[state]&0x38)<<2;
    if(b==0 && stateProps[state]>=0x40) {
        /* skip byte sequences with leading zeros because they are not stored in the fromUnicode table */
        codePoints[0]=U_SENTINEL;
        b=1;
    }
    limit=((stateProps[state]&7)+1)<<5;
    while(b<limit) {
        int32_t entry=row[b];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            int32_t nextState=MBCS_ENTRY_TRANSITION_STATE(entry);
            if(stateProps[nextState]>=0) {
                /* recurse to a state with non-ignorable actions */
                if(!enumToU(
                        mbcsTable, stateProps, nextState,
                        offset+MBCS_ENTRY_TRANSITION_OFFSET(entry),
                        value|(uint32_t)b,
                        callback, context,
                        pErrorCode)) {
                    return FALSE;
                }
            }
            codePoints[b&0x1f]=U_SENTINEL;
        } else {
            UChar32 c;
            int32_t action;

            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=MBCS_ENTRY_FINAL_ACTION(entry);
            if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            } else if(action==MBCS_STATE_VALID_16) {
                int32_t finalOffset=offset+MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[finalOffset];
                if(c<0xfffe) {
                    /* output BMP code point */
                } else {
                    c=U_SENTINEL;
                }
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                int32_t finalOffset=offset+MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[finalOffset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                } else if(c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=((c&0x3ff)<<10)+unicodeCodeUnits[finalOffset]+(0x10000-0xdc00);
                } else if(c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[finalOffset];
                } else {
                    c=U_SENTINEL;
                }
            } else if(action==MBCS_STATE_VALID_DIRECT_20) {
                /* output supplementary code point */
                c=(UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
            } else {
                c=U_SENTINEL;
            }

            codePoints[b&0x1f]=c;
            anyCodePoints&=c;
        }
        if(((++b)&0x1f)==0) {
            if(anyCodePoints>=0) {
                if(!callback(context, value|(uint32_t)(b-0x20), codePoints)) {
                    return FALSE;
                }
                anyCodePoints=-1;
            }
        }
    }
    return TRUE;
}